

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O2

double fmin(double __x,double __y)

{
  bool bVar1;
  ExactFloat *in_RDX;
  ExactFloat *in_RSI;
  ExactFloat *in_RDI;
  ExactFloat *b;
  double extraout_XMM0_Qa;
  
  b = in_RDX;
  if ((in_RSI->bn_exp_ != 0x7fffffff) && (b = in_RSI, in_RDX->bn_exp_ != 0x7fffffff)) {
    if (in_RSI->sign_ == in_RDX->sign_) {
      bVar1 = operator<(in_RSI,in_RDX);
      b = in_RDX;
      if (bVar1) {
        b = in_RSI;
      }
    }
    else {
      b = in_RDX;
      if (in_RSI->sign_ < in_RDX->sign_) {
        b = in_RSI;
      }
    }
  }
  ExactFloat::ExactFloat(in_RDI,b);
  return extraout_XMM0_Qa;
}

Assistant:

ExactFloat fmin(const ExactFloat& a, const ExactFloat& b) {
  // If one argument is NaN, return the other argument.
  if (a.is_nan()) return b;
  if (b.is_nan()) return a;
  // Not required by IEEE 754, but we prefer -0 over +0.
  if (a.sign_ != b.sign_) {
    return (a.sign_ < b.sign_) ? a : b;
  }
  return (a < b) ? a : b;
}